

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O2

void Wln_WriteNdr(Wln_Ntk_t *p,char *pFileName)

{
  void *pDesign;
  
  pDesign = Wln_NtkToNdr(p);
  Ndr_Write(pFileName,pDesign);
  Ndr_Delete(pDesign);
  printf("Dumped the current design into file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Wln_WriteNdr( Wln_Ntk_t * p, char * pFileName )
{
    void * pDesign = Wln_NtkToNdr( p );
    Ndr_Write( pFileName, pDesign );
    Ndr_Delete( pDesign );
    printf( "Dumped the current design into file \"%s\".\n", pFileName );
}